

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O2

double ON_MatrixSolutionPrecision
                 (uint N,double **M,bool bTransposeM,double lambda,double *X,double *B)

{
  double dVar1;
  ulong uVar2;
  undefined7 in_register_00000011;
  ulong uVar3;
  ulong uVar4;
  double *pdVar5;
  double *pdVar6;
  double dVar7;
  double dVar8;
  
  uVar2 = (ulong)N;
  if ((int)CONCAT71(in_register_00000011,bTransposeM) == 0) {
    dVar7 = 0.0;
    for (uVar3 = 0; uVar3 != uVar2; uVar3 = uVar3 + 1) {
      pdVar5 = M[uVar3];
      dVar8 = -X[uVar3] * lambda;
      for (pdVar6 = X; pdVar6 < X + uVar2; pdVar6 = pdVar6 + 1) {
        dVar1 = *pdVar5;
        pdVar5 = pdVar5 + 1;
        dVar8 = dVar8 + dVar1 * *pdVar6;
      }
      dVar1 = ABS(dVar8 - B[uVar3]);
      if (ABS(dVar8 - B[uVar3]) <= dVar7) {
        dVar1 = dVar7;
      }
      dVar7 = dVar1;
    }
  }
  else {
    dVar7 = 0.0;
    for (uVar3 = 0; uVar3 != uVar2; uVar3 = uVar3 + 1) {
      dVar8 = -X[uVar3] * lambda;
      for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
        dVar8 = dVar8 + M[uVar4][uVar3] * X[uVar4];
      }
      dVar1 = ABS(dVar8 - B[uVar3]);
      if (ABS(dVar8 - B[uVar3]) <= dVar7) {
        dVar1 = dVar7;
      }
      dVar7 = dVar1;
    }
  }
  return dVar7;
}

Assistant:

double ON_MatrixSolutionPrecision(
  const unsigned int N,
  const double*const* M,
  bool bTransposeM,
  double lambda,
  const double* X,
  const double* B
  )
{
  double delta = 0.0;
  if (bTransposeM)
  {
    for (unsigned int i = 0; i < N; i++)
    {
      const double* e = X;
      double Mei = -(lambda*e[i]);
      for ( unsigned int j = 0; j < N; j++ )
        Mei += M[j][i]*(*e++);
      double d = fabs(Mei - B[i]);
      if (d > delta)
        delta = d;
    }
  }
  else
  {
    const double* e0 = X + N;
    for (unsigned int i = 0; i < N; i++)
    {
      const double* Mi = M[i];
      const double* e = X;
      double Mei = -(lambda*e[i]);
      while (e < e0)
        Mei += (*Mi++)*(*e++);
      double d = fabs(Mei - B[i]);
      if (d > delta)
        delta = d;
    }
  }

  return delta;
}